

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

uint32_t secp256k1_scalar_get_bits_limb32(secp256k1_scalar *a,uint offset,uint count)

{
  uint in_EDX;
  uint in_ESI;
  uint *in_RDI;
  uint local_4;
  
  secp256k1_scalar_verify((secp256k1_scalar *)0x12300b);
  if (in_EDX == 0 || 0x20 < in_EDX) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/scalar_low_impl.h"
            ,0x1f,"test condition failed: count > 0 && count <= 32");
    abort();
  }
  if (in_ESI < 0x20) {
    local_4 = *in_RDI >> ((byte)in_ESI & 0x1f) & 0xffffffffU >> (0x20U - (char)in_EDX & 0x1f);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SECP256K1_INLINE static uint32_t secp256k1_scalar_get_bits_limb32(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    SECP256K1_SCALAR_VERIFY(a);

    VERIFY_CHECK(count > 0 && count <= 32);
    if (offset < 32) {
        return (*a >> offset) & (0xFFFFFFFF >> (32 - count));
    } else {
        return 0;
    }
}